

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

size_t Curl_bufq_space(bufq *q)

{
  buf_chunk *local_20;
  buf_chunk *chunk;
  size_t space;
  bufq *q_local;
  
  chunk = (buf_chunk *)0x0;
  if (q->tail != (buf_chunk *)0x0) {
    chunk = (buf_chunk *)chunk_space(q->tail);
  }
  if (q->spare != (buf_chunk *)0x0) {
    for (local_20 = q->spare; local_20 != (buf_chunk *)0x0; local_20 = local_20->next) {
      chunk = (buf_chunk *)((long)&chunk->next + local_20->dlen);
    }
  }
  if (q->chunk_count < q->max_chunks) {
    chunk = (buf_chunk *)((long)&chunk->next + (q->max_chunks - q->chunk_count) * q->chunk_size);
  }
  return (size_t)chunk;
}

Assistant:

size_t Curl_bufq_space(const struct bufq *q)
{
  size_t space = 0;
  if(q->tail)
    space += chunk_space(q->tail);
  if(q->spare) {
    struct buf_chunk *chunk = q->spare;
    while(chunk) {
      space += chunk->dlen;
      chunk = chunk->next;
    }
  }
  if(q->chunk_count < q->max_chunks) {
    space += (q->max_chunks - q->chunk_count) * q->chunk_size;
  }
  return space;
}